

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatrix<Fad<double>_>::Transpose(TPZMatrix<Fad<double>_> *this,TPZMatrix<Fad<double>_> *T)

{
  long lVar1;
  long lVar2;
  long lVar3;
  Fad<double> FStack_48;
  
  (*(T->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xd])
            (T,(this->super_TPZBaseMatrix).fCol,(this->super_TPZBaseMatrix).fRow);
  lVar2 = (this->super_TPZBaseMatrix).fRow;
  if (0 < lVar2) {
    lVar1 = (this->super_TPZBaseMatrix).fCol;
    lVar3 = 0;
    do {
      if (0 < lVar1) {
        lVar2 = 0;
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&FStack_48,this,lVar3,lVar2);
          (*(T->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (T,lVar2,lVar3,&FStack_48);
          Fad<double>::~Fad(&FStack_48);
          lVar2 = lVar2 + 1;
          lVar1 = (this->super_TPZBaseMatrix).fCol;
        } while (lVar2 < lVar1);
        lVar2 = (this->super_TPZBaseMatrix).fRow;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < lVar2);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Transpose(TPZMatrix<TVar> *T) const {
	T->Resize( Cols(), Rows() );
	
	for ( int64_t r = 0; r < Rows(); r++ ) {
        for ( int64_t c = 0; c < Cols(); c++ ) {
            T->PutVal( c, r, GetVal( r, c ) );
        }
    }
}